

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::CFLSubAvgTest_SubAvgTest_Test::~CFLSubAvgTest_SubAvgTest_Test
          (CFLSubAvgTest_SubAvgTest_Test *this)

{
  anon_unknown.dwarf_2d0ac2::CFLSubAvgTest_SubAvgTest_Test::~CFLSubAvgTest_SubAvgTest_Test
            ((CFLSubAvgTest_SubAvgTest_Test *)(this + -0x18));
  return;
}

Assistant:

TEST_P(CFLSubAvgTest, SubAvgTest) {
  int16_t dst[CFL_BUF_SQUARE];
  int16_t dst_ref[CFL_BUF_SQUARE];
  for (int it = 0; it < NUM_ITERATIONS; it++) {
    randData(&ACMRandom::Rand15);
    sub_avg(data, dst);
    sub_avg_ref(data_ref, dst_ref);
    assert_eq<int16_t>(dst, dst_ref, width, height);
  }
}